

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branching.cpp
# Opt level: O1

bool __thiscall PriorityBranchGroup::finished(PriorityBranchGroup *this)

{
  int iVar1;
  int *pt;
  Tint *pTVar2;
  ulong uVar3;
  bool bVar4;
  TrailElem local_30;
  
  if ((this->super_BranchGroup).fin.v == 0) {
    bVar4 = (this->annotations).sz != 0;
    if (bVar4) {
      iVar1 = (**(*(this->annotations).data)->_vptr_Branching)();
      if ((char)iVar1 != '\0') {
        uVar3 = 1;
        do {
          bVar4 = uVar3 < (this->annotations).sz;
          if (!bVar4) goto LAB_001b83bd;
          iVar1 = (**(this->annotations).data[uVar3]->_vptr_Branching)();
          uVar3 = uVar3 + 1;
        } while ((char)iVar1 != '\0');
      }
      if (bVar4) {
        return false;
      }
    }
LAB_001b83bd:
    pTVar2 = &(this->super_BranchGroup).fin;
    local_30.x = pTVar2->v;
    local_30.sz = 4;
    local_30.pt = &pTVar2->v;
    vec<TrailElem>::push(&engine.trail,&local_30);
    pTVar2->v = 1;
  }
  return true;
}

Assistant:

bool PriorityBranchGroup::finished() {
	if (fin != 0) {
		return true;
	}
	for (unsigned int i = 0; i < annotations.size(); i++) {
		if (!annotations[i]->finished()) {
			return false;
		}
	}
	fin = 1;
	return true;
}